

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int processInputFile(string *in_file_path)

{
  StkFloat SVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  unsigned_long uVar7;
  StkFormat SVar8;
  StkFloat *pSVar9;
  size_t sVar10;
  uchar *dpcm_buff;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double local_3a8;
  int local_20c;
  int volume_max;
  int dpcm_initial_volume;
  uchar *dpcm;
  int dpcm_frames;
  ulong local_1d8;
  size_t i_2;
  StkFrames progress_out_buff;
  undefined1 local_198 [4];
  uint32_t i_1;
  StkFrames preprocess_buff;
  int src_frames;
  double dst_rate;
  uint ch;
  uint32_t i;
  StkFrames floatbuff;
  double normalize_gain;
  StkFrames filebuff;
  StkFloat in_samplerate;
  uint32_t in_frames;
  StkError err;
  undefined1 local_88 [8];
  FileRead in_file;
  string local_30 [8];
  string in_file_name;
  string *in_file_path_local;
  
  std::__cxx11::string::string(local_30);
  getFileNameDeletingDirectory(in_file_path,(string *)local_30);
  poVar6 = std::operator<<((ostream *)&std::cout,"----------------------------------");
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<((ostream *)&std::cout,"input file: ");
  poVar6 = std::operator<<(poVar6,(string *)in_file_path);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  stk::FileRead::FileRead((FileRead *)local_88);
  std::__cxx11::string::string((string *)&err.type_,(string *)in_file_path);
  stk::FileRead::open((FileRead *)local_88,(char *)&err.type_,0,0x40d5888000000000,1,2);
  std::__cxx11::string::~string((string *)&err.type_);
  uVar7 = stk::FileRead::fileSize((FileRead *)local_88);
  uVar2 = (uint)uVar7;
  filebuff.bufferSize_ = (size_t)stk::FileRead::fileRate((FileRead *)local_88);
  uVar3 = stk::FileRead::channels((FileRead *)local_88);
  stk::StkFrames::StkFrames((StkFrames *)&normalize_gain,uVar2,uVar3);
  stk::FileRead::read((FileRead *)local_88,(int)&normalize_gain,(void *)0x0,0);
  floatbuff.bufferSize_ = 0x3ff0000000000000;
  SVar8 = stk::FileRead::format((FileRead *)local_88);
  if (SVar8 == 1) {
    floatbuff.bufferSize_ = 0x4060000000000000;
  }
  SVar8 = stk::FileRead::format((FileRead *)local_88);
  if (SVar8 == 2) {
    floatbuff.bufferSize_ = 0x40e0000000000000;
  }
  SVar8 = stk::FileRead::format((FileRead *)local_88);
  if (SVar8 == 4) {
    floatbuff.bufferSize_ = 0x4160000000000000;
  }
  SVar8 = stk::FileRead::format((FileRead *)local_88);
  if (SVar8 == 8) {
    floatbuff.bufferSize_ = 0x41e0000000000000;
  }
  uVar3 = stk::FileRead::channels((FileRead *)local_88);
  floatbuff.bufferSize_ = (size_t)((double)floatbuff.bufferSize_ * (double)uVar3);
  stk::StkFrames::StkFrames((StkFrames *)&ch,uVar2,1);
  for (dst_rate._4_4_ = 0; dst_rate._4_4_ < uVar2; dst_rate._4_4_ = dst_rate._4_4_ + 1) {
    pSVar9 = stk::StkFrames::operator[]((StkFrames *)&ch,(ulong)dst_rate._4_4_);
    *pSVar9 = 0.0;
    for (dst_rate._0_4_ = 0; uVar3 = stk::FileRead::channels((FileRead *)local_88),
        dst_rate._0_4_ < uVar3; dst_rate._0_4_ = dst_rate._0_4_ + 1) {
      uVar3 = stk::FileRead::channels((FileRead *)local_88);
      pSVar9 = stk::StkFrames::operator[]
                         ((StkFrames *)&normalize_gain,
                          (ulong)(dst_rate._4_4_ * uVar3 + dst_rate._0_4_));
      dVar13 = wave_gain;
      dVar12 = *pSVar9 / (double)floatbuff.bufferSize_;
      pSVar9 = stk::StkFrames::operator[]((StkFrames *)&ch,(ulong)dst_rate._4_4_);
      *pSVar9 = dVar12 * dVar13 + *pSVar9;
    }
  }
  uVar3 = stk::FileRead::channels((FileRead *)local_88);
  if (1 < uVar3) {
    poVar6 = std::operator<<((ostream *)&std::cout,"convert ");
    uVar3 = stk::FileRead::channels((FileRead *)local_88);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar3);
    poVar6 = std::operator<<(poVar6," channels to mono.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  dVar13 = dpcmSampleRateValue(sample_rate_ind);
  preprocess_buff.bufferSize_._4_4_ =
       (uint)(((double)(uVar7 & 0xffffffff) * dVar13) / (double)filebuff.bufferSize_ + 1.0);
  stk::StkFrames::StkFrames((StkFrames *)local_198,preprocess_buff.bufferSize_._4_4_,1);
  if ((no_resampling & 1U) == 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"resample ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,(double)filebuff.bufferSize_);
    poVar6 = std::operator<<(poVar6,"Hz to ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,dVar13);
    poVar6 = std::operator<<(poVar6,"Hz");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    preprocess_buff.bufferSize_._4_4_ =
         resample((StkFrames *)&ch,(double)filebuff.bufferSize_,(StkFrames *)local_198,
                  preprocess_buff.bufferSize_._4_4_,dVar13,0.995,0x100);
    stk::StkFrames::resize((StkFrames *)local_198,(long)(int)preprocess_buff.bufferSize_._4_4_,1);
    uVar2 = preprocess_buff.bufferSize_._4_4_;
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,"no resampling.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    preprocess_buff.bufferSize_._4_4_ = uVar2;
    stk::StkFrames::resize((StkFrames *)local_198,(long)(int)uVar2,1);
    for (progress_out_buff.bufferSize_._4_4_ = 0; progress_out_buff.bufferSize_._4_4_ < uVar2;
        progress_out_buff.bufferSize_._4_4_ = progress_out_buff.bufferSize_._4_4_ + 1) {
      pSVar9 = stk::StkFrames::operator[]
                         ((StkFrames *)&ch,(ulong)progress_out_buff.bufferSize_._4_4_);
      SVar1 = *pSVar9;
      pSVar9 = stk::StkFrames::operator[]
                         ((StkFrames *)local_198,(ulong)progress_out_buff.bufferSize_._4_4_);
      *pSVar9 = SVar1;
    }
  }
  preprocess_buff.bufferSize_._4_4_ = uVar2;
  stk::Stk::setSampleRate(dVar13);
  preprocessInputBuffer
            ((string *)local_30,(StkFrames *)local_198,dVar13,shifter_weight,center_bias_level,
             (bool)(use_linearity_correction & 1));
  if ((output_preprocessed & 1U) != 0) {
    sVar10 = stk::StkFrames::size((StkFrames *)local_198);
    stk::StkFrames::StkFrames((StkFrames *)&i_2,(uint)sVar10,1);
    for (local_1d8 = 0; uVar11 = local_1d8, sVar10 = stk::StkFrames::size((StkFrames *)local_198),
        uVar11 < sVar10; local_1d8 = local_1d8 + 1) {
      pSVar9 = stk::StkFrames::operator[]((StkFrames *)local_198,local_1d8);
      SVar1 = *pSVar9;
      pSVar9 = stk::StkFrames::operator[]((StkFrames *)&i_2,local_1d8);
      *pSVar9 = SVar1;
      pSVar9 = stk::StkFrames::operator[]((StkFrames *)&i_2,local_1d8);
      if (1.0 < *pSVar9) {
        pSVar9 = stk::StkFrames::operator[]((StkFrames *)&i_2,local_1d8);
        *pSVar9 = 1.0;
      }
      pSVar9 = stk::StkFrames::operator[]((StkFrames *)&i_2,local_1d8);
      if (*pSVar9 <= -1.0 && *pSVar9 != -1.0) {
        pSVar9 = stk::StkFrames::operator[]((StkFrames *)&i_2,local_1d8);
        *pSVar9 = -1.0;
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&dpcm_frames,"_processed",(allocator *)((long)&dpcm + 7))
    ;
    outputBufferToFile((string *)local_30,(StkFrames *)&i_2,(string *)&dpcm_frames,dVar13);
    std::__cxx11::string::~string((string *)&dpcm_frames);
    std::allocator<char>::~allocator((allocator<char> *)((long)&dpcm + 7));
    stk::StkFrames::~StkFrames((StkFrames *)&i_2);
  }
  uVar2 = preprocess_buff.bufferSize_._4_4_ + 0x7f;
  if ((int)(preprocess_buff.bufferSize_._4_4_ + 0x7f) < 0) {
    uVar2 = preprocess_buff.bufferSize_._4_4_ + 0xfe;
  }
  dpcm._0_4_ = uVar2 & 0xffffff80;
  uVar2 = (uint)dpcm;
  if ((int)(uint)dpcm < 0) {
    uVar2 = (uint)dpcm + 7;
  }
  uVar11 = (ulong)((int)uVar2 >> 3);
  if ((long)uVar11 < 0) {
    uVar11 = 0xffffffffffffffff;
  }
  dpcm_buff = (uchar *)operator_new__(uVar11);
  if (force_initial_volume < 0) {
    pSVar9 = stk::StkFrames::operator[]((StkFrames *)local_198,0);
    local_3a8 = *pSVar9 * 64.0;
  }
  else {
    local_3a8 = (double)(force_initial_volume / 2);
  }
  local_20c = (int)local_3a8 << 1;
  if (local_20c < 0) {
    local_20c = 0;
  }
  uVar2 = (uint)dpcm;
  if ((int)(uint)dpcm < 0) {
    uVar2 = (uint)dpcm + 7;
  }
  dpcm._0_4_ = encodeDpcm((StkFrames *)local_198,local_20c,dpcm_buff,(int)uVar2 >> 3,dither_mode,
                          noise_shape_mode,(bool)(use_linearity_correction & 1));
  iVar4 = decodeDpcm((string *)local_30,dpcm_buff,(uint)dpcm,local_20c,center_bias_level,
                     (bool)(output_encoded_wav & 1),dVar13);
  iVar5 = outputDpcmToFile((string *)local_30,dpcm_buff,(uint)dpcm,local_20c);
  if (iVar5 == 0) {
    if (dpcm_buff != (uchar *)0x0) {
      operator_delete__(dpcm_buff);
    }
    iVar5 = (uint)dpcm;
    if ((int)(uint)dpcm < 0) {
      iVar5 = (uint)dpcm + 7;
    }
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5 >> 3);
    std::operator<<(poVar6," bytes");
    poVar6 = std::operator<<((ostream *)&std::cout,"(");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,preprocess_buff.bufferSize_._4_4_);
    poVar6 = std::operator<<(poVar6,"samples+");
    poVar6 = (ostream *)
             std::ostream::operator<<(poVar6,(uint)dpcm - preprocess_buff.bufferSize_._4_4_);
    poVar6 = std::operator<<(poVar6,"samples padding)");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<((ostream *)&std::cout,"initial volume: ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_20c);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<((ostream *)&std::cout,"max volume: ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    stk::StkFrames::~StkFrames((StkFrames *)local_198);
    stk::StkFrames::~StkFrames((StkFrames *)&ch);
    stk::StkFrames::~StkFrames((StkFrames *)&normalize_gain);
    stk::FileRead::~FileRead((FileRead *)local_88);
    std::__cxx11::string::~string(local_30);
    return 0;
  }
  exit(1);
}

Assistant:

int processInputFile(const std::string &in_file_path)
{
	std::string in_file_name;
	getFileNameDeletingDirectory(in_file_path, in_file_name);
	
	std::cout << "----------------------------------" << std::endl;
	std::cout << "input file: " << in_file_path << std::endl;
	
	// 入力ファイルを読み込む
	stk::FileRead in_file;
	try {
		in_file.open(in_file_path);
	}
	catch(stk::StkError err) {
		std::cout << "can not open file: " << in_file_path << std::endl;
		exit(1);
	}
	uint32_t		in_frames = static_cast<uint32_t>(in_file.fileSize());
	stk::StkFloat	in_samplerate = in_file.fileRate();
	stk::StkFrames	filebuff(in_frames, in_file.channels());
	in_file.read(filebuff, 0, false);
	
	// モノラル、float型フォーマットに変換する
	double normalize_gain = 1.0;
	if (in_file.format() == stk::FileRead::STK_SINT8) {
		normalize_gain = 128.0;
	}
	if (in_file.format() == stk::FileRead::STK_SINT16) {
		normalize_gain = 32768.0;
	}
	if (in_file.format() == stk::FileRead::STK_SINT24) {
		normalize_gain = 8388608.0;
	}
	if (in_file.format() == stk::FileRead::STK_SINT32) {
		normalize_gain = 2147483648.0;
	}
	normalize_gain *= in_file.channels();

	stk::StkFrames	floatbuff(in_frames, 1);
	for (uint32_t i=0; i<in_frames; ++i) {
		floatbuff[i] = 0;
		for (unsigned int ch=0; ch<in_file.channels(); ++ch) {
			floatbuff[i] += (filebuff[i*in_file.channels() + ch] / normalize_gain) * wave_gain;
		}
	}
	if (in_file.channels() > 1) {
		std::cout << "convert " << in_file.channels() << " channels to mono." << std::endl;
	}
	
	// 目的のDPCMのサンプリングレートに変換
	double dst_rate = dpcmSampleRateValue(sample_rate_ind);
	int	src_frames = static_cast<int>(in_frames * dst_rate / in_samplerate + 1);
	stk::StkFrames preprocess_buff(src_frames, 1);
	
	if (no_resampling) {
		std::cout << "no resampling." << std::endl;
		src_frames = in_frames;
		preprocess_buff.resize(src_frames);
		for (uint32_t i=0; i<in_frames; ++i) {
			preprocess_buff[i] = floatbuff[i];
		}
		src_frames = in_frames;
	}
	else {
		std::cout << "resample " << in_samplerate << "Hz to " << dst_rate << "Hz" << std::endl;
		src_frames = resample(floatbuff, in_samplerate, preprocess_buff,
							  src_frames, dst_rate, 0.995, resample_window_len);
		preprocess_buff.resize(src_frames);
	}
	
	
	// stkの動作サンプリングレートを変更する
	stk::Stk::setSampleRate(dst_rate);
	
	// 波形の前処理を行う
	preprocessInputBuffer(in_file_name, preprocess_buff, dst_rate,
						  shifter_weight, center_bias_level,
						  use_linearity_correction);
	
	if (output_preprocessed) {
		// 中心補正済み波形を出力
		stk::StkFrames	progress_out_buff((uint32_t)preprocess_buff.size(), 1);
		for (size_t i=0; i<preprocess_buff.size(); ++i) {
			progress_out_buff[i] = preprocess_buff[i];
			if (progress_out_buff[i] > 1.0) progress_out_buff[i] = 1.0;
			if (progress_out_buff[i] < -1.0) progress_out_buff[i] = -1.0;
		}
		outputBufferToFile(in_file_name, progress_out_buff, "_processed", dst_rate);
	}
	
	// DPCM変換の開始
	// サイズは16byte=128sample境界に合うように切り上げ
	int dpcm_frames = ((src_frames + 127) / 128) * 128;
	unsigned char *dpcm = new unsigned char[dpcm_frames / 8];
	int dpcm_initial_volume = 2*static_cast<int>((force_initial_volume >= 0)?(force_initial_volume/2):(preprocess_buff[0] * 64.0));
	if (dpcm_initial_volume < 0) {
		dpcm_initial_volume = 0;
	}
	dpcm_frames = encodeDpcm(preprocess_buff, dpcm_initial_volume,
							 dpcm, dpcm_frames/8, dither_mode, noise_shape_mode,
							 use_linearity_correction);
	
	// 波形最大値を求めるために復号する
	int volume_max = decodeDpcm(in_file_name, dpcm, dpcm_frames, dpcm_initial_volume, center_bias_level, output_encoded_wav, dst_rate);
	
	// dmcファイル出力
	if (outputDpcmToFile(in_file_name, dpcm, dpcm_frames, dpcm_initial_volume)) {
		exit(1);
	}
	
	delete [] dpcm;
	
	std::cout << dpcm_frames/8 << " bytes";
	std::cout << "(" << src_frames << "samples+" << (dpcm_frames - src_frames) << "samples padding)" << std::endl;
	std::cout << "initial volume: " << dpcm_initial_volume << std::endl;
	std::cout << "max volume: " << volume_max << std::endl;
	
	return 0;
}